

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

vector<int_*,_std::allocator<int_*>_> * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::queryRectangle(vector<int_*,_std::allocator<int_*>_> *__return_storage_ptr__,
                KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,Node *node,int *searchMin,int *searchMax,int *currentRegionMin,
                int *currentRegionMax,uint depth)

{
  pointer *pppiVar1;
  Node *node_00;
  int *piVar2;
  iterator __position;
  undefined8 uVar3;
  int *currentRegionMin_00;
  int *currentRegionMax_00;
  int *currentRegionMin_01;
  int *currentRegionMax_01;
  ulong uVar4;
  ulong uVar5;
  undefined1 local_68 [8];
  vector<int_*,_std::allocator<int_*>_> resultLeft;
  
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_00 = node->left;
  if (node_00 == (Node *)0x0) {
    piVar2 = node->value;
    if (*piVar2 < *searchMin) {
      return __return_storage_ptr__;
    }
    if (*searchMax < *piVar2) {
      return __return_storage_ptr__;
    }
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if ((uVar4 == 4) || (piVar2[uVar4 + 1] < searchMin[uVar4 + 1])) break;
      uVar5 = uVar4 + 1;
    } while (piVar2[uVar4 + 1] <= searchMax[uVar4 + 1]);
    if (uVar4 < 4) {
      return __return_storage_ptr__;
    }
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = piVar2;
      pppiVar1 = &(__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppiVar1 = *pppiVar1 + 1;
      return __return_storage_ptr__;
    }
    std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*const&>
              ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,__position,&node->value);
    return __return_storage_ptr__;
  }
  resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)node;
  currentRegionMin_00 = (int *)operator_new__(0x14);
  currentRegionMax_00 = (int *)operator_new__(0x14);
  currentRegionMin_01 = (int *)operator_new__(0x14);
  currentRegionMax_01 = (int *)operator_new__(0x14);
  currentRegionMin_00[4] = currentRegionMin[4];
  uVar3 = *(undefined8 *)(currentRegionMin + 2);
  *(undefined8 *)currentRegionMin_00 = *(undefined8 *)currentRegionMin;
  *(undefined8 *)(currentRegionMin_00 + 2) = uVar3;
  currentRegionMax_00[4] = currentRegionMax[4];
  uVar3 = *(undefined8 *)(currentRegionMax + 2);
  *(undefined8 *)currentRegionMax_00 = *(undefined8 *)currentRegionMax;
  *(undefined8 *)(currentRegionMax_00 + 2) = uVar3;
  currentRegionMin_01[4] = currentRegionMin[4];
  uVar3 = *(undefined8 *)(currentRegionMin + 2);
  *(undefined8 *)currentRegionMin_01 = *(undefined8 *)currentRegionMin;
  *(undefined8 *)(currentRegionMin_01 + 2) = uVar3;
  currentRegionMax_01[4] = currentRegionMax[4];
  uVar3 = *(undefined8 *)(currentRegionMax + 2);
  *(undefined8 *)currentRegionMax_01 = *(undefined8 *)currentRegionMax;
  *(undefined8 *)(currentRegionMax_01 + 2) = uVar3;
  piVar2 = resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage[2];
  uVar5 = (ulong)(depth % 5 << 2);
  *(undefined4 *)((long)currentRegionMax_00 + uVar5) = *(undefined4 *)((long)piVar2 + uVar5);
  *(undefined4 *)((long)currentRegionMin_01 + uVar5) = *(undefined4 *)((long)piVar2 + uVar5);
  if ((*currentRegionMin_00 < *searchMin) || (*searchMax < *currentRegionMax_00)) {
LAB_00102f53:
    if ((*searchMin <= *currentRegionMax_00) && (*currentRegionMin_00 <= *searchMax)) {
      uVar5 = 0;
      do {
        uVar4 = uVar5;
        if ((uVar4 == 4) || (currentRegionMax_00[uVar4 + 1] < searchMin[uVar4 + 1])) break;
        uVar5 = uVar4 + 1;
      } while (currentRegionMin_00[uVar4 + 1] <= searchMax[uVar4 + 1]);
      if (3 < uVar4) {
        queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_68,this,node_00,searchMin,
                       searchMax,currentRegionMin_00,currentRegionMax_00,depth + 1);
        std::vector<int*,std::allocator<int*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>>
                  ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,local_68);
        if (local_68 != (undefined1  [8])0x0) {
          operator_delete((void *)local_68);
        }
      }
    }
  }
  else {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if ((uVar4 == 4) || (currentRegionMin_00[uVar4 + 1] < searchMin[uVar4 + 1])) break;
      uVar5 = uVar4 + 1;
    } while (currentRegionMax_00[uVar4 + 1] <= searchMax[uVar4 + 1]);
    if (uVar4 < 4) goto LAB_00102f53;
    reportSubtree(this,node_00,__return_storage_ptr__);
  }
  if ((*searchMin <= *currentRegionMin_01) && (*currentRegionMax_01 <= *searchMax)) {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if ((uVar4 == 4) || (currentRegionMin_01[uVar4 + 1] < searchMin[uVar4 + 1])) break;
      uVar5 = uVar4 + 1;
    } while (currentRegionMax_01[uVar4 + 1] <= searchMax[uVar4 + 1]);
    if (3 < uVar4) {
      reportSubtree(this,(Node *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage[1],
                    __return_storage_ptr__);
      goto LAB_001030cb;
    }
  }
  if ((*searchMin <= *currentRegionMax_01) && (*currentRegionMin_01 <= *searchMax)) {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if ((uVar4 == 4) || (currentRegionMax_01[uVar4 + 1] < searchMin[uVar4 + 1])) break;
      uVar5 = uVar4 + 1;
    } while (currentRegionMin_01[uVar4 + 1] <= searchMax[uVar4 + 1]);
    if (3 < uVar4) {
      queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_68,this,
                     (Node *)resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1],searchMin,searchMax,
                     currentRegionMin_01,currentRegionMax_01,depth + 1);
      std::vector<int*,std::allocator<int*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>>
                ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish,local_68,
                 resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_68 != (undefined1  [8])0x0) {
        operator_delete((void *)local_68);
      }
    }
  }
LAB_001030cb:
  operator_delete__(currentRegionMin_00);
  operator_delete__(currentRegionMax_00);
  operator_delete__(currentRegionMin_01);
  operator_delete__(currentRegionMax_01);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}